

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::PaddingLayerParams::clear_PaddingType(PaddingLayerParams *this)

{
  uint32 uVar1;
  
  uVar1 = this->_oneof_case_[0];
  if ((((uVar1 == 3) || (uVar1 == 2)) || (uVar1 == 1)) &&
     ((this->PaddingType_).constant_ != (PaddingLayerParams_PaddingConstant *)0x0)) {
    (*(((this->PaddingType_).constant_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void PaddingLayerParams::clear_PaddingType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.PaddingLayerParams)
  switch (PaddingType_case()) {
    case kConstant: {
      delete PaddingType_.constant_;
      break;
    }
    case kReflection: {
      delete PaddingType_.reflection_;
      break;
    }
    case kReplication: {
      delete PaddingType_.replication_;
      break;
    }
    case PADDINGTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = PADDINGTYPE_NOT_SET;
}